

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

void __thiscall
tlx::CmdlineParser::Argument::Argument
          (Argument *this,char key,string *longkey,string *keytype,string *desc,bool required)

{
  bool required_local;
  string *desc_local;
  string *keytype_local;
  string *longkey_local;
  char key_local;
  Argument *this_local;
  
  this->_vptr_Argument = (_func_int **)&PTR__Argument_001e6920;
  this->key_ = key;
  std::__cxx11::string::string((string *)&this->longkey_,(string *)longkey);
  std::__cxx11::string::string((string *)&this->keytype_,(string *)keytype);
  std::__cxx11::string::string((string *)&this->desc_,(string *)desc);
  this->required_ = required;
  this->found_ = false;
  this->repeated_ = false;
  return;
}

Assistant:

Argument(char key, const std::string& longkey, const std::string& keytype,
             const std::string& desc, bool required)
        : key_(key), longkey_(longkey), keytype_(keytype), desc_(desc),
          required_(required) { }